

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shadow_box.cxx
# Opt level: O1

void fl_shadow_frame(int x,int y,int w,int h,Fl_Color c)

{
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)(x + 3),(ulong)((h + y) - 3),(ulong)(w - 3U),3);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
            (fl_graphics_driver,(ulong)((x + w) - 3),(ulong)(y + 3),3,(ulong)(h - 3U));
  Fl::set_box_color(c);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)(uint)y,(ulong)(w - 3U),(ulong)(h - 3U));
  return;
}

Assistant:

static void fl_shadow_frame(int x, int y, int w, int h, Fl_Color c) {
  fl_color(FL_DARK3);
  fl_rectf(x+BW, y+h-BW,  w - BW, BW);
  fl_rectf(x+w-BW,  y+BW, BW,  h - BW);
  Fl::set_box_color(c);
  fl_rect(x,y,w-BW,h-BW);
}